

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<std::array<double,3ul>>(Attribute *this,array<double,_3UL> *v)

{
  value_type *pvVar1;
  optional<std::array<double,_3UL>_> local_60;
  undefined1 local_40 [8];
  optional<std::array<double,_3UL>_> ret;
  array<double,_3UL> *v_local;
  Attribute *this_local;
  
  if (v == (array<double,_3UL> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._16_8_ = v;
    primvar::PrimVar::get_value<std::array<double,3ul>>(&local_60,&this->_var);
    nonstd::optional_lite::optional<std::array<double,_3UL>_>::optional<std::array<double,_3UL>,_0>
              ((optional<std::array<double,_3UL>_> *)local_40,&local_60);
    nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional(&local_60);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_40);
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<std::array<double,_3UL>_>::value
                         ((optional<std::array<double,_3UL>_> *)local_40);
      *(double *)ret.contained._16_8_ = pvVar1->_M_elems[0];
      *(double *)(ret.contained._16_8_ + 8) = pvVar1->_M_elems[1];
      *(double *)(ret.contained._16_8_ + 0x10) = pvVar1->_M_elems[2];
    }
    nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional
              ((optional<std::array<double,_3UL>_> *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }